

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O2

float tcu::execCompare(Vec4 *color,CompareMode compare,int chanNdx,float ref_,bool isFixedPoint)

{
  undefined7 in_register_00000009;
  float fVar1;
  undefined4 in_XMM0_Db;
  float fVar2;
  undefined1 auVar3 [16];
  
  fVar2 = color->m_data[chanNdx];
  if ((int)CONCAT71(in_register_00000009,isFixedPoint) != 0) {
    auVar3._4_4_ = ref_;
    auVar3._0_4_ = fVar2;
    auVar3._8_4_ = 0;
    auVar3._12_4_ = in_XMM0_Db;
    auVar3 = minps(_DAT_009a4d00,auVar3);
    fVar2 = (float)(-(uint)(0.0 <= fVar2) & auVar3._0_4_);
    ref_ = (float)(-(uint)(0.0 <= ref_) & auVar3._4_4_);
  }
  fVar1 = 0.0;
  switch(compare) {
  case COMPAREMODE_LESS:
    if (fVar2 <= ref_) {
      return 0.0;
    }
    break;
  case COMPAREMODE_LESS_OR_EQUAL:
    if (fVar2 < ref_) {
      return 0.0;
    }
    break;
  case COMPAREMODE_GREATER:
    if (ref_ <= fVar2) {
      return 0.0;
    }
    break;
  case COMPAREMODE_GREATER_OR_EQUAL:
    if (ref_ < fVar2) {
      return 0.0;
    }
    break;
  case COMPAREMODE_EQUAL:
    if (ref_ != fVar2) {
      return 0.0;
    }
    if (NAN(ref_) || NAN(fVar2)) {
      return 0.0;
    }
    break;
  case COMPAREMODE_NOT_EQUAL:
    if ((ref_ == fVar2) && (!NAN(ref_) && !NAN(fVar2))) {
      return 0.0;
    }
    break;
  case COMPAREMODE_ALWAYS:
    break;
  default:
    goto switchD_00968608_default;
  }
  fVar1 = 1.0;
switchD_00968608_default:
  return fVar1;
}

Assistant:

const T&				operator[]	(int ndx) const		{ DE_ASSERT(de::inBounds(ndx, 0, Size)); return m_data[ndx]; }